

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6522Implementation.hpp
# Opt level: O3

void __thiscall
MOS::MOS6522::
MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler>
::set_control_line_output
          (MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler>
           *this,Port port,Line line,LineState value)

{
  HalfCycles *pHVar1;
  VIAPortHandler *this_00;
  long lVar2;
  
  if (line == Two && port == B) {
    (this->super_MOS6522Storage).control_outputs_[1].lines[1] = value;
    evaluate_cb2_output(this);
    return;
  }
  if (((this->super_MOS6522Storage).control_outputs_[port].lines[line] != value) &&
     ((this->super_MOS6522Storage).control_outputs_[port].lines[line] = value, value != Input)) {
    this_00 = this->bus_handler_;
    lVar2 = (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_;
    (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_ = 0;
    pHVar1 = &this_00->audio_->time_since_update;
    (pHVar1->super_WrappedInt<HalfCycles>).length_ =
         (pHVar1->super_WrappedInt<HalfCycles>).length_ + lVar2 * 5;
    Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler
    ::set_control_line_output(this_00,port,line,value != Off);
    return;
  }
  return;
}

Assistant:

void MOS6522<T>::set_control_line_output(Port port, Line line, LineState value) {
	if(port == Port::B && line == Line::Two) {
		control_outputs_[port].lines[line] = value;
		evaluate_cb2_output();
	} else {
		// Do nothing if unchanged.
		if(value == control_outputs_[port].lines[line]) {
			return;
		}

		control_outputs_[port].lines[line] = value;

		if(value != LineState::Input) {
			bus_handler_.run_for(time_since_bus_handler_call_.flush<HalfCycles>());
			bus_handler_.set_control_line_output(port, line, value != LineState::Off);
		}
	}
}